

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_cache_lcp_2way<true,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  ulong lcp0;
  uchar **__dest;
  uint *puVar7;
  uint local_bc;
  uchar **local_b8;
  ulong *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong *local_98;
  uint *local_90;
  uchar **local_88;
  lcp_t *local_78;
  size_t local_70;
  uchar **local_68;
  uint *local_60;
  size_t local_58;
  size_t local_40;
  int local_38;
  
  local_b0 = lcp_result;
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  local_58 = n1;
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_90 = cache_input0 + 1;
  uVar5 = *cache_input0;
  local_60 = cache_input1 + 1;
  local_bc = *cache_input1;
  local_78 = lcp_input1;
  local_68 = from1;
  if (uVar5 < local_bc) {
    iVar3 = cmp(*from0,*from1);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
    uVar4 = lcp(uVar5,local_bc);
    if (uVar4 == 0) {
      local_a8 = 0;
    }
    else {
      local_a8 = (ulong)uVar4;
      local_bc = get_char<unsigned_int>(*from1,local_a8);
    }
    *result = *from0;
    *cache_result = uVar5;
    local_70 = n0 - 1;
    if (local_70 != 0) {
      local_88 = from0 + 1;
      local_a0 = *lcp_input0;
      local_98 = lcp_input0 + 1;
      uVar5 = cache_input0[1];
      local_90 = cache_input0 + 2;
      goto LAB_001d0b5b;
    }
LAB_001d0920:
    local_b8 = result + 1;
    puVar7 = cache_result + 1;
    __dest = local_b8;
  }
  else {
    local_98 = lcp_input0;
    local_88 = from0;
    local_70 = n0;
    if (local_bc < uVar5) {
      iVar3 = cmp(*from0,*from1);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      uVar4 = lcp(uVar5,local_bc);
      if (uVar4 == 0) {
        local_a0 = 0;
      }
      else {
        local_a0 = (ulong)uVar4;
        uVar5 = get_char<unsigned_int>(*from0,local_a0);
      }
      *result = *from1;
      __dest = result + 1;
      *cache_result = local_bc;
      puVar7 = cache_result + 1;
      local_58 = n1 - 1;
      if (local_58 != 0) {
        local_68 = from1 + 1;
        local_a8 = *lcp_input1;
        local_78 = lcp_input1 + 1;
        local_bc = cache_input1[1];
        local_60 = cache_input1 + 2;
        goto LAB_001d0b5b;
      }
LAB_001d0a13:
      if (local_70 == 0) {
        __assert_fail("n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x527,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      *lcp_result = local_a0;
      *puVar7 = uVar5;
      memmove(__dest,from0,local_70 * 8);
      memmove(lcp_result + 1,local_98,local_70 * 8);
      local_60 = local_90;
      local_58 = local_70;
      goto LAB_001d0a61;
    }
    if ((char)uVar5 == '\0') {
      iVar3 = cmp(*from0,*from1);
      if (iVar3 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      uVar4 = lcp(uVar5,local_bc);
      *result = *from0;
      *cache_result = uVar5;
      local_a8 = (ulong)uVar4;
      local_bc = 0;
      if (n0 != 1) {
        local_a0 = *lcp_input0;
        uVar5 = cache_input0[1];
LAB_001d0b56:
        local_70 = n0 - 1;
        local_88 = from0 + 1;
        local_98 = lcp_input0 + 1;
        local_bc = 0;
        local_90 = cache_input0 + 2;
LAB_001d0b5b:
        local_b8 = result + 1;
        puVar6 = cache_result + 1;
        lcp0 = local_a0;
        from0 = local_88;
LAB_001d0b65:
        sVar2 = local_58;
        check_lcp_and_cache<unsigned_int>
                  (local_b8[-1],*from0,lcp0,uVar5,*local_68,local_a8,local_bc);
        if (local_a8 < lcp0) {
          iVar3 = cmp(*from0,*local_68);
          if (-1 < iVar3) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4ae,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                         );
          }
          *local_b8 = *from0;
          *local_b0 = lcp0;
LAB_001d0bdb:
          *puVar6 = uVar5;
          lcp0 = *local_98;
          uVar5 = *local_90;
        }
        else {
          local_a0 = lcp0;
          if (lcp0 < local_a8) {
            iVar3 = cmp(*from0,*local_68);
            if (iVar3 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4b7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            *local_b8 = *local_68;
            *local_b0 = local_a8;
            *puVar6 = local_bc;
            local_a8 = *local_78;
            local_bc = *local_60;
LAB_001d0cd1:
            local_58 = local_58 - 1;
            local_60 = local_60 + 1;
            local_68 = local_68 + 1;
            local_78 = local_78 + 1;
            __dest = local_b8 + 1;
            lcp_result = local_b0 + 1;
            puVar7 = puVar6 + 1;
            puVar6 = puVar7;
            lcp0 = local_a0;
            local_b8 = __dest;
            local_b0 = lcp_result;
            if (sVar2 == 1) goto LAB_001d0a13;
            goto LAB_001d0b65;
          }
          if (uVar5 < local_bc) {
            iVar3 = cmp(*from0,*local_68);
            if (-1 < iVar3) {
              __assert_fail("cmp(*from0, *from1) < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4c6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            uVar4 = lcp(uVar5,local_bc);
            if (uVar4 != 0) {
              local_a8 = local_a8 + uVar4;
              local_bc = get_char<unsigned_int>(*local_68,local_a8);
            }
            *local_b8 = *from0;
            *local_b0 = lcp0;
            goto LAB_001d0bdb;
          }
          if (local_bc < uVar5) {
            iVar3 = cmp(*from0,*local_68);
            if (iVar3 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            uVar4 = lcp(uVar5,local_bc);
            if (uVar4 != 0) {
              local_a0 = lcp0 + uVar4;
              uVar5 = get_char<unsigned_int>(*from0,local_a0);
            }
            *local_b8 = *local_68;
            *local_b0 = local_a8;
            *puVar6 = local_bc;
            local_a8 = *local_78;
            local_bc = *local_60;
            goto LAB_001d0cd1;
          }
          if ((char)uVar5 == '\0') {
            iVar3 = cmp(*from0,*local_68);
            if (iVar3 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            *local_b8 = *from0;
            *local_b0 = lcp0;
            *puVar6 = uVar5;
            lcp0 = *local_98;
            uVar5 = lcp(uVar5,local_bc);
            local_a8 = local_a8 + uVar5;
            uVar5 = *local_90;
            local_bc = 0;
          }
          else {
            compare((uchar *)&local_40,*from0,(size_t)*local_68);
            local_a0 = local_40;
            local_a8 = local_40;
            if (-1 < local_38) {
              __dest = local_b8 + 1;
              lcp_result = local_b0 + 1;
              puVar7 = puVar6 + 1;
              if (local_38 == 0) {
                *local_b8 = *from0;
                *local_b0 = lcp0;
                *puVar6 = uVar5;
                lcp0 = *local_98;
                uVar5 = *local_90;
                local_bc = 0;
                goto LAB_001d0c1d;
              }
              puVar1 = *local_68;
              local_68 = local_68 + 1;
              *local_b8 = puVar1;
              *local_b0 = lcp0;
              *puVar6 = uVar5;
              local_a8 = *local_78;
              local_78 = local_78 + 1;
              uVar5 = get_char<unsigned_int>(*from0,local_40);
              local_bc = *local_60;
              local_60 = local_60 + 1;
              local_58 = local_58 - 1;
              puVar6 = puVar7;
              lcp0 = local_a0;
              local_b8 = __dest;
              local_b0 = lcp_result;
              if (local_58 == 0) goto LAB_001d0a13;
              goto LAB_001d0b65;
            }
            *local_b8 = *from0;
            *local_b0 = lcp0;
            *puVar6 = uVar5;
            lcp0 = *local_98;
            uVar5 = *local_90;
            local_bc = get_char<unsigned_int>(*local_68,local_40);
          }
        }
LAB_001d0c1d:
        local_90 = local_90 + 1;
        local_98 = local_98 + 1;
        puVar7 = puVar6 + 1;
        __dest = local_b8 + 1;
        lcp_result = local_b0 + 1;
        from0 = from0 + 1;
        local_70 = local_70 - 1;
        puVar6 = puVar7;
        local_b8 = __dest;
        local_b0 = lcp_result;
        if (local_70 == 0) goto LAB_001d092d;
        goto LAB_001d0b65;
      }
      goto LAB_001d0920;
    }
    compare((uchar *)&local_40,*from0,(size_t)*from1);
    local_a0 = local_40;
    local_a8 = local_40;
    if (local_38 < 0) {
      *result = *from0;
      __dest = result + 1;
      *cache_result = uVar5;
      puVar7 = cache_result + 1;
      local_a0 = *lcp_input0;
      uVar5 = cache_input0[1];
      local_bc = get_char<unsigned_int>(*from1,local_40);
      local_70 = n0 - 1;
      if (local_70 != 0) {
        local_88 = from0 + 1;
        local_98 = lcp_input0 + 1;
        local_90 = cache_input0 + 2;
        goto LAB_001d0b5b;
      }
    }
    else {
      __dest = result + 1;
      puVar7 = cache_result + 1;
      if (local_38 != 0) {
        *result = *from1;
        *cache_result = local_bc;
        local_a8 = *lcp_input1;
        uVar5 = get_char<unsigned_int>(*from0,local_40);
        local_58 = n1 - 1;
        if (local_58 != 0) {
          local_68 = from1 + 1;
          local_78 = lcp_input1 + 1;
          local_bc = cache_input1[1];
          local_60 = cache_input1 + 2;
          goto LAB_001d0b5b;
        }
        goto LAB_001d0a13;
      }
      *result = *from0;
      *cache_result = uVar5;
      local_bc = 0;
      if (n0 != 1) {
        local_a0 = *lcp_input0;
        uVar5 = cache_input0[1];
        goto LAB_001d0b56;
      }
    }
  }
LAB_001d092d:
  if (local_58 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                 );
  }
  *lcp_result = local_a8;
  *puVar7 = local_bc;
  memmove(__dest,local_68,local_58 * 8);
  memmove(lcp_result + 1,local_78,local_58 * 8);
LAB_001d0a61:
  memmove(puVar7 + 1,local_60,local_58 << 2);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}